

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O3

bool bssl::dtls_seal_record
               (SSL *ssl,DTLSRecordNumber *out_number,uint8_t *out,size_t *out_len,size_t max_out,
               uint8_t type,uint8_t *in,size_t in_len,uint16_t epoch)

{
  byte bVar1;
  DTLS1_STATE *pDVar2;
  RecordNumberEncrypter *pRVar3;
  Span<const_unsigned_char> header;
  byte *pbVar4;
  bool bVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  ushort uVar8;
  int iVar9;
  byte *pbVar10;
  ulong seqnum;
  uchar *puVar11;
  long lVar12;
  byte *out_00;
  uintptr_t b_u;
  ulong uVar13;
  int line;
  undefined7 in_register_00000089;
  ulong uVar14;
  DTLSWriteEpoch *pDVar15;
  byte *out_prefix;
  Span<const_unsigned_char> in_00;
  uint8_t mask [2];
  size_t ciphertext_len;
  uint8_t local_9d;
  byte local_9c;
  byte local_9b;
  ushort local_9a;
  undefined8 local_98;
  uchar *local_90;
  byte *local_88;
  SSLAEADContext *local_80;
  ushort local_78;
  undefined6 uStack_76;
  uint8_t *local_70;
  byte *local_68;
  byte *local_60;
  size_t local_58;
  DTLSRecordNumber *local_50;
  size_t *local_48;
  byte *local_40;
  uchar *puStack_38;
  
  local_80 = (SSLAEADContext *)CONCAT44(local_80._4_4_,(int)CONCAT71(in_register_00000089,type));
  local_9d = type;
  local_48 = out_len;
  pbVar10 = (byte *)dtls_seal_prefix_len(ssl,epoch);
  if ((in < out + max_out && out < in + in_len) && (max_out < pbVar10 || out + (long)pbVar10 != in))
  {
    iVar9 = 0xbd;
    line = 0x1e6;
  }
  else {
    pDVar2 = ssl->d1;
    uVar13 = (pDVar2->write_epoch).next_record.combined_;
    local_50 = out_number;
    if ((uint16_t)(uVar13 >> 0x30) == epoch) {
      pDVar15 = &pDVar2->write_epoch;
LAB_00235bc9:
      local_88 = pbVar10;
      local_68 = out;
      if (ssl->s3->version == 0) {
        puVar11 = (uchar *)0xd;
      }
      else {
        uVar6 = ssl_protocol_version(ssl);
        puVar11 = (uchar *)0xd;
        if (epoch != 0) {
          puVar11 = (uchar *)((ulong)(uVar6 < 0x304) * 8 + 5);
        }
        uVar13 = (pDVar15->next_record).combined_;
      }
      if ((uVar13 & 0xffffffffffff) == 0xffffffffffff) {
        iVar9 = 0x45;
        line = 0x1f6;
      }
      else {
        local_90 = puVar11;
        if (((ssl->s3->version == 0) || (uVar6 = ssl_protocol_version(ssl), epoch == 0)) ||
           (uVar6 < 0x304)) {
          local_58 = 0;
          local_98 = 0;
          local_70 = (uint8_t *)0x0;
        }
        else {
          local_70 = &local_9d;
          local_98 = CONCAT71((int7)((ulong)local_70 >> 8),1);
          local_58 = 1;
        }
        bVar5 = SSLAEADContext::CiphertextLen
                          ((pDVar15->aead)._M_t.
                           super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,
                           (size_t *)&local_78,in_len,local_58);
        if (bVar5) {
          if (local_90 + CONCAT62(uStack_76,local_78) <= max_out) {
            if (ssl->s3->version == 0) {
              uVar6 = 0xfeff;
            }
            else {
              uVar7 = ssl_protocol_version(ssl);
              uVar6 = 0xfefd;
              if (uVar7 < 0x304) {
                uVar6 = ssl->s3->version;
              }
            }
            bVar1 = (byte)local_80;
            if ((char)local_98 == '\0') {
              *local_68 = bVar1;
              uVar8 = uVar6 << 8 | uVar6 >> 8;
              *(ulong *)(local_68 + 3) =
                   uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                   (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                   (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
              lVar12 = 0xb;
            }
            else {
              *local_68 = (byte)epoch & 3 | 0x2c;
              uVar8 = (ushort)(pDVar15->next_record).combined_;
              uVar8 = uVar8 << 8 | uVar8 >> 8;
              lVar12 = 3;
            }
            *(ushort *)(local_68 + lVar12) = local_78 << 8 | local_78 >> 8;
            *(ushort *)(local_68 + 1) = uVar8;
            local_80 = (pDVar15->aead)._M_t.
                       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
            out_00 = local_88 + (long)local_68;
            seqnum = uVar13;
            pbVar10 = out_00 + in_len;
            out_prefix = local_68 + (long)local_90;
            if ((ssl->s3->version != 0) &&
               (local_9a = uVar6, local_88 = local_68 + (long)local_90, local_60 = out_00 + in_len,
               uVar7 = ssl_protocol_version(ssl), seqnum = uVar13 & 0xffffffffffff,
               pbVar10 = local_60, out_prefix = local_88, uVar6 = local_9a, uVar7 < 0x304)) {
              seqnum = uVar13;
            }
            pbVar4 = local_68;
            local_40 = local_68;
            uVar14 = (ulong)uVar6;
            header.size_ = (size_t)local_90;
            header.data_ = local_68;
            puStack_38 = local_90;
            bVar5 = SSLAEADContext::SealScatter
                              (local_80,out_prefix,out_00,pbVar10,bVar1,uVar6,seqnum,header,in,
                               in_len,local_70,local_58);
            if (!bVar5) {
              return false;
            }
            if ((char)local_98 != '\0') {
              pRVar3 = (pDVar15->rn_encrypter)._M_t.
                       super___uniq_ptr_impl<bssl::RecordNumberEncrypter,_bssl::internal::Deleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_bssl::RecordNumberEncrypter_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_bssl::RecordNumberEncrypter_*,_false>._M_head_impl;
              iVar9 = (*pRVar3->_vptr_RecordNumberEncrypter[4])
                                (pRVar3,&local_9c,2,out_prefix,CONCAT62(uStack_76,local_78));
              if ((char)iVar9 == '\0') {
                return false;
              }
              pbVar4[1] = pbVar4[1] ^ local_9c;
              pbVar4[2] = pbVar4[2] ^ local_9b;
            }
            local_50->combined_ = uVar13;
            (pDVar15->next_record).combined_ = uVar13 + 1;
            *local_48 = (size_t)(local_90 + CONCAT62(uStack_76,local_78));
            in_00.size_ = uVar14;
            in_00.data_ = local_90;
            ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x100,(int)pbVar4,in_00);
            return true;
          }
          iVar9 = 0x79;
          line = 0x209;
        }
        else {
          iVar9 = 200;
          line = 0x205;
        }
      }
    }
    else {
      bVar1 = (pDVar2->extra_write_epochs).size_;
      if (bVar1 != 0) {
        lVar12 = 0;
        do {
          pDVar15 = *(DTLSWriteEpoch **)((pDVar2->extra_write_epochs).storage_ + lVar12);
          uVar13 = (pDVar15->next_record).combined_;
          if ((uint16_t)(uVar13 >> 0x30) == epoch) goto LAB_00235bc9;
          lVar12 = lVar12 + 8;
        } while ((ulong)bVar1 * 8 != lVar12);
      }
      iVar9 = 0x44;
      line = 0x1ed;
    }
  }
  ERR_put_error(0x10,0,iVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                ,line);
  return false;
}

Assistant:

bool dtls_seal_record(SSL *ssl, DTLSRecordNumber *out_number, uint8_t *out,
                      size_t *out_len, size_t max_out, uint8_t type,
                      const uint8_t *in, size_t in_len, uint16_t epoch) {
  const size_t prefix = dtls_seal_prefix_len(ssl, epoch);
  if (buffers_alias(in, in_len, out, max_out) &&
      (max_out < prefix || out + prefix != in)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_OUTPUT_ALIASES_INPUT);
    return false;
  }

  // Determine the parameters for the current epoch.
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const size_t record_header_len = dtls_record_header_write_len(ssl, epoch);

  // Ensure the sequence number update does not overflow.
  DTLSRecordNumber record_number = write_epoch->next_record;
  if (!record_number.HasNext()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }

  bool dtls13_header = use_dtls13_record_header(ssl, epoch);
  uint8_t *extra_in = NULL;
  size_t extra_in_len = 0;
  if (dtls13_header) {
    extra_in = &type;
    extra_in_len = 1;
  }

  size_t ciphertext_len;
  if (!write_epoch->aead->CiphertextLen(&ciphertext_len, in_len,
                                        extra_in_len)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (max_out < record_header_len + ciphertext_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BUFFER_TOO_SMALL);
    return false;
  }

  uint16_t record_version = dtls_record_version(ssl);
  if (dtls13_header) {
    // The first byte of the DTLS 1.3 record header has the following format:
    // 0 1 2 3 4 5 6 7
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|C|S|L|E E|
    // +-+-+-+-+-+-+-+-+
    //
    // We set C=0 (no Connection ID), S=1 (16-bit sequence number), L=1 (length
    // is present), which is a mask of 0x2c. The E E bits are the low-order two
    // bits of the epoch.
    //
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|0|1|1|E E|
    // +-+-+-+-+-+-+-+-+
    out[0] = 0x2c | (epoch & 0x3);
    // We always use a two-byte sequence number. A one-byte sequence number
    // would require coordinating with the application on ACK feedback to know
    // that the peer is not too far behind.
    CRYPTO_store_u16_be(out + 1, write_epoch->next_record.sequence());
    // TODO(crbug.com/42290594): When we know the record is last in the packet,
    // omit the length.
    CRYPTO_store_u16_be(out + 3, ciphertext_len);
  } else {
    out[0] = type;
    CRYPTO_store_u16_be(out + 1, record_version);
    CRYPTO_store_u64_be(out + 3, record_number.combined());
    CRYPTO_store_u16_be(out + 11, ciphertext_len);
  }
  Span<const uint8_t> header(out, record_header_len);

  if (!write_epoch->aead->SealScatter(
          out + record_header_len, out + prefix, out + prefix + in_len, type,
          record_version, dtls_aead_sequence(ssl, record_number), header, in,
          in_len, extra_in, extra_in_len)) {
    return false;
  }

  // Perform record number encryption (RFC 9147 section 4.2.3).
  if (dtls13_header) {
    // Record number encryption uses bytes from the ciphertext as a sample to
    // generate the mask used for encryption. For simplicity, pass in the whole
    // ciphertext as the sample - GenerateRecordNumberMask will read only what
    // it needs (and error if |sample| is too short).
    Span<const uint8_t> sample(out + record_header_len, ciphertext_len);
    uint8_t mask[2];
    if (!write_epoch->rn_encrypter->GenerateMask(mask, sample)) {
      return false;
    }
    out[1] ^= mask[0];
    out[2] ^= mask[1];
  }

  *out_number = record_number;
  write_epoch->next_record = record_number.Next();
  *out_len = record_header_len + ciphertext_len;
  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HEADER, header);
  return true;
}